

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  type_conflict5 tVar1;
  DataKey DVar2;
  DataKey *pDVar3;
  SPxId enterId;
  SPxId enterIdCo;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_d0;
  DataKey local_c8;
  cpp_dec_float<50U,_int,_void> local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  double local_50;
  cpp_dec_float<50U,_int,_void> local_48;
  
  local_d0.info = 0;
  local_d0.idx = -1;
  local_c8.info = 0;
  local_c8.idx = -1;
  local_c0.data._M_elems[0] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[0];
  local_88.m_backend.data._M_elems[9] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[9];
  local_88.m_backend.data._M_elems._20_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 5);
  local_88.m_backend.data._M_elems._28_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 7);
  local_88.m_backend.data._M_elems._4_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 1);
  local_88.m_backend.data._M_elems._12_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 3);
  local_c0.exp = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thetolerance.m_backend.exp;
  local_c0.fpclass =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.fpclass;
  local_c0.neg = (bool)((local_c0.data._M_elems[0] != 0 || local_c0.fpclass != cpp_dec_float_finite)
                       ^ (this->
                         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).thetolerance.m_backend.neg);
  local_c0.prec_elem =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.prec_elem;
  local_c0.data._M_elems._4_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 1);
  local_c0.data._M_elems._12_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 3);
  local_c0.data._M_elems._20_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 5);
  local_c0.data._M_elems._28_8_ =
       *(undefined8 *)
        ((this->
         super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).thetolerance.m_backend.data._M_elems + 7);
  local_c0.data._M_elems[9] =
       (this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thetolerance.m_backend.data._M_elems[9];
  local_88.m_backend.data._M_elems[0] = local_c0.data._M_elems[0];
  local_88.m_backend.exp = local_c0.exp;
  local_88.m_backend.neg = local_c0.neg;
  local_88.m_backend.fpclass = local_c0.fpclass;
  local_88.m_backend.prec_elem = local_c0.prec_elem;
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnter == true) {
    local_d0 = (DataKey)selectEnterSparseDim(this,&local_88,(SPxId *)&local_d0);
  }
  else {
    local_d0 = (DataKey)selectEnterDenseDim(this,&local_88,(SPxId *)&local_d0);
  }
  if (((this->
       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).thesolver)->sparsePricingEnterCo == true) {
    DVar2 = (DataKey)selectEnterSparseCoDim
                               (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_c0,(SPxId *)&local_d0);
  }
  else {
    DVar2 = (DataKey)selectEnterDenseCoDim
                               (this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_c0,(SPxId *)&local_d0);
  }
  local_c8 = DVar2;
  if (local_d0.info != 0) {
    local_50 = 0.8;
    local_48.fpclass = cpp_dec_float_finite;
    local_48.prec_elem = 10;
    local_48.data._M_elems[0] = 0;
    local_48.data._M_elems[1] = 0;
    local_48.data._M_elems[2] = 0;
    local_48.data._M_elems[3] = 0;
    local_48.data._M_elems[4] = 0;
    local_48.data._M_elems[5] = 0;
    local_48.data._M_elems._24_5_ = 0;
    local_48.data._M_elems[7]._1_3_ = 0;
    local_48.data._M_elems._32_5_ = 0;
    local_48._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&local_48,&local_c0,&local_50);
    tVar1 = boost::multiprecision::operator>
                      (&local_88,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_48);
    if ((tVar1) || (DVar2.info == 0)) {
      pDVar3 = &local_d0;
      goto LAB_0026c92b;
    }
  }
  pDVar3 = &local_c8;
LAB_0026c92b:
  return (SPxId)*pDVar3;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}